

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

size_t duckdb_httplib::detail::to_utf8(int code,char *buff)

{
  byte bVar1;
  size_t sStack_8;
  
  bVar1 = (byte)code;
  if (code < 0x80) {
    *buff = bVar1 & 0x7f;
    sStack_8 = 1;
  }
  else if ((uint)code < 0x800) {
    *buff = (byte)((uint)code >> 6) | 0xc0;
    buff[1] = bVar1 & 0x3f | 0x80;
    sStack_8 = 2;
  }
  else {
    if (0xd7ff < (uint)code) {
      if ((uint)code < 0xe000) {
        return 0;
      }
      if (0xffff < (uint)code) {
        if (0x10ffff < (uint)code) {
          return 0;
        }
        *buff = (byte)((uint)code >> 0x12) | 0xf0;
        buff[1] = (byte)((uint)code >> 0xc) & 0x3f | 0x80;
        buff[2] = (byte)((uint)code >> 6) & 0x3f | 0x80;
        buff[3] = bVar1 & 0x3f | 0x80;
        return 4;
      }
    }
    *buff = (byte)((uint)code >> 0xc) | 0xe0;
    buff[1] = (byte)((uint)code >> 6) & 0x3f | 0x80;
    buff[2] = bVar1 & 0x3f | 0x80;
    sStack_8 = 3;
  }
  return sStack_8;
}

Assistant:

inline size_t to_utf8(int code, char *buff) {
  if (code < 0x0080) {
    buff[0] = static_cast<char>(code & 0x7F);
    return 1;
  } else if (code < 0x0800) {
    buff[0] = static_cast<char>(0xC0 | ((code >> 6) & 0x1F));
    buff[1] = static_cast<char>(0x80 | (code & 0x3F));
    return 2;
  } else if (code < 0xD800) {
    buff[0] = static_cast<char>(0xE0 | ((code >> 12) & 0xF));
    buff[1] = static_cast<char>(0x80 | ((code >> 6) & 0x3F));
    buff[2] = static_cast<char>(0x80 | (code & 0x3F));
    return 3;
  } else if (code < 0xE000) { // D800 - DFFF is invalid...
    return 0;
  } else if (code < 0x10000) {
    buff[0] = static_cast<char>(0xE0 | ((code >> 12) & 0xF));
    buff[1] = static_cast<char>(0x80 | ((code >> 6) & 0x3F));
    buff[2] = static_cast<char>(0x80 | (code & 0x3F));
    return 3;
  } else if (code < 0x110000) {
    buff[0] = static_cast<char>(0xF0 | ((code >> 18) & 0x7));
    buff[1] = static_cast<char>(0x80 | ((code >> 12) & 0x3F));
    buff[2] = static_cast<char>(0x80 | ((code >> 6) & 0x3F));
    buff[3] = static_cast<char>(0x80 | (code & 0x3F));
    return 4;
  }

  // NOTREACHED
  return 0;
}